

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_MeshTopology::TopVertexIsHidden(ON_MeshTopology *this,int topvi)

{
  int *piVar1;
  uint uVar2;
  ON_MeshTopologyVertex *pOVar3;
  bool *pbVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  if (this->m_mesh == (ON_Mesh *)0x0) {
    bVar7 = false;
  }
  else {
    pbVar4 = ON_Mesh::HiddenVertexArray(this->m_mesh);
    bVar7 = false;
    if (((-1 < topvi) && (bVar7 = false, pbVar4 != (bool *)0x0)) && (topvi < (this->m_topv).m_count)
       ) {
      pOVar3 = (this->m_topv).m_a;
      uVar2 = pOVar3[(uint)topvi].m_v_count;
      uVar6 = 0;
      uVar5 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar5 = uVar6;
      }
      do {
        bVar7 = uVar5 == uVar6;
        if (bVar7) {
          return bVar7;
        }
        piVar1 = pOVar3[(uint)topvi].m_vi + uVar6;
        uVar6 = uVar6 + 1;
      } while (pbVar4[*piVar1] != false);
    }
  }
  return bVar7;
}

Assistant:

bool ON_MeshTopology::TopVertexIsHidden( int topvi ) const
{
  const bool* bHiddenVertex = m_mesh ? m_mesh->HiddenVertexArray() : 0;
  if ( bHiddenVertex && topvi >= 0 && topvi < m_topv.Count() )
  {
    const ON_MeshTopologyVertex& topv = m_topv[topvi];
    int i;
    for ( i = 0; i < topv.m_v_count; i++ )
    {
      if ( !bHiddenVertex[topv.m_vi[i]] )
        return false;
    }
    return true;
  }
  return false;
}